

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

plink * Plink_new(void)

{
  undefined1 auVar1 [16];
  plink *ppVar2;
  size_t sVar3;
  size_t sVar4;
  char *__dest;
  char *pcVar5;
  FILE *pFVar6;
  char *__modes;
  char *pcVar7;
  char *suffix;
  long lVar8;
  lemon *lemp;
  undefined1 auVar9 [16];
  long lVar10;
  
  ppVar2 = plink_freelist;
  if (plink_freelist == (plink *)0x0) {
    lVar8 = 100;
    pcVar7 = (char *)0x10;
    ppVar2 = (plink *)calloc(100,0x10);
    auVar1 = _DAT_0010d020;
    if (ppVar2 == (plink *)0x0) {
      plink_freelist = ppVar2;
      Plink_new_cold_1();
      pcVar5 = *(char **)(lVar8 + 200);
      suffix = pcVar7;
      sVar3 = strlen(pcVar5);
      sVar4 = strlen(pcVar7);
      lemp = (lemon *)(long)((int)sVar4 + (int)sVar3 + 5);
      __dest = (char *)malloc((size_t)lemp);
      if (__dest == (char *)0x0) {
        file_makename_cold_1();
        if (lemp->outname != (char *)0x0) {
          free(lemp->outname);
        }
        pcVar7 = file_makename(lemp,suffix);
        lemp->outname = pcVar7;
        pFVar6 = fopen(pcVar7,__modes);
        if ((pFVar6 == (FILE *)0x0) && (*__modes == 'w')) {
          file_open_cold_1();
        }
        return (plink *)pFVar6;
      }
      strcpy(__dest,pcVar5);
      pcVar5 = strrchr(__dest,0x2e);
      if (pcVar5 != (char *)0x0) {
        *pcVar5 = '\0';
      }
      ppVar2 = (plink *)strcat(__dest,pcVar7);
      return ppVar2;
    }
    lVar8 = 0x18;
    auVar9 = _DAT_0010d010;
    do {
      lVar10 = auVar9._8_8_;
      if (SUB164(auVar9 ^ auVar1,4) == -0x80000000 && SUB164(auVar9 ^ auVar1,0) < -0x7fffff9d) {
        *(plink **)((long)&ppVar2[-1].cfp + lVar8) = ppVar2 + auVar9._0_8_ + 1;
        *(plink **)((long)&ppVar2->cfp + lVar8) = ppVar2 + lVar10 + 1;
      }
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0x658);
    ppVar2[99].next = (plink *)0x0;
  }
  plink_freelist = ppVar2->next;
  return ppVar2;
}

Assistant:

struct plink *Plink_new(){
  struct plink *newlink;

  if( plink_freelist==0 ){
    int i;
    int amt = 100;
    plink_freelist = (struct plink *)calloc( amt, sizeof(struct plink) );
    if( plink_freelist==0 ){
      fprintf(stderr,
      "Unable to allocate memory for a new follow-set propagation link.\n");
      exit(1);
    }
    for(i=0; i<amt-1; i++) plink_freelist[i].next = &plink_freelist[i+1];
    plink_freelist[amt-1].next = 0;
  }
  newlink = plink_freelist;
  plink_freelist = plink_freelist->next;
  return newlink;
}